

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O0

void __thiscall MIDISong2::DoRestart(MIDISong2 *this)

{
  DWORD DVar1;
  TrackInfo *pTVar2;
  int local_14;
  int i;
  MIDISong2 *this_local;
  
  for (local_14 = 0; local_14 < this->NumTracks; local_14 = local_14 + 1) {
    this->Tracks[local_14].TrackP = 0;
    this->Tracks[local_14].Finished = false;
    this->Tracks[local_14].RunningStatus = '\0';
    this->Tracks[local_14].Designated = false;
    this->Tracks[local_14].Designation = 0;
    this->Tracks[local_14].LoopCount = -1;
    this->Tracks[local_14].EProgramChange = false;
    this->Tracks[local_14].EVolume = false;
    this->Tracks[local_14].PlayedTime = 0;
  }
  ProcessInitialMetaEvents(this);
  for (local_14 = 0; local_14 < this->NumTracks; local_14 = local_14 + 1) {
    DVar1 = TrackInfo::ReadVarLen(this->Tracks + local_14);
    this->Tracks[local_14].Delay = DVar1;
  }
  this->TrackDue = this->Tracks;
  pTVar2 = FindNextDue(this);
  this->TrackDue = pTVar2;
  return;
}

Assistant:

void MIDISong2 :: DoRestart()
{
	int i;

	// Set initial state.
	for (i = 0; i < NumTracks; ++i)
	{
		Tracks[i].TrackP = 0;
		Tracks[i].Finished = false;
		Tracks[i].RunningStatus = 0;
		Tracks[i].Designated = false;
		Tracks[i].Designation = 0;
		Tracks[i].LoopCount = -1;
		Tracks[i].EProgramChange = false;
		Tracks[i].EVolume = false;
		Tracks[i].PlayedTime = 0;
	}
	ProcessInitialMetaEvents ();
	for (i = 0; i < NumTracks; ++i)
	{
		Tracks[i].Delay = Tracks[i].ReadVarLen();
	}
	TrackDue = Tracks;
	TrackDue = FindNextDue();
}